

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetGlslInsts(GraphicsRobustAccessPass *this)

{
  undefined1 *args_3;
  Module *pMVar1;
  Instruction *pIVar2;
  Pass *pPVar3;
  bool bVar4;
  uint32_t uVar5;
  Operand *this_00;
  Instruction *inst;
  Instruction **ppIVar6;
  int local_e0;
  spv_operand_type_t local_dc;
  Pass *local_d8;
  IRContext *local_d0;
  char glsl [13];
  Instruction *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  Operand local_98;
  initializer_list<spvtools::opt::Operand> local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (*(uint32_t *)&this->field_0x38 != 0) {
    return *(uint32_t *)&this->field_0x38;
  }
  args_3 = &this->field_0x38;
  builtin_strncpy(glsl + 8,".450",5);
  builtin_strncpy(glsl,"GLSL.std",8);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  local_d8 = &this->super_Pass;
  while (pPVar3 = local_d8, pIVar2 = *ppIVar6,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->ext_inst_imports_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    this_00 = Instruction::GetInOperand(pIVar2,0);
    Operand::AsString_abi_cxx11_((string *)&local_98,this_00);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_98,glsl);
    std::__cxx11::string::_M_dispose();
    if (bVar4) {
      uVar5 = Instruction::result_id(pIVar2);
      *(uint32_t *)args_3 = uVar5;
    }
    ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  uVar5 = *(uint32_t *)args_3;
  if (uVar5 == 0) {
    uVar5 = Pass::TakeNextId(local_d8);
    *(uint32_t *)&pPVar3[1]._vptr_Pass = uVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,glsl,(allocator<char> *)&local_58);
    utils::MakeVector(&words,(string *)&local_98);
    std::__cxx11::string::_M_dispose();
    local_d0 = pPVar3->context_;
    local_e0 = 0;
    local_dc = SPV_OPERAND_TYPE_LITERAL_STRING;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&words);
    local_98.type = SPV_OPERAND_TYPE_LITERAL_STRING;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98.words,&local_58);
    local_68._M_len = 1;
    local_68._M_array = &local_98;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b8,&local_d0,&local_dc,&local_e0,(uint *)args_3,&local_68);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    pIVar2 = local_b8;
    local_b8 = (Instruction *)0x0;
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
               (Instruction *)
               ((long)&(((pPVar3->context_->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                       ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8));
    pPVar3->field_0x34 = 1;
    IRContext::AnalyzeDefUse(pPVar3->context_,pIVar2);
    IRContext::ResetFeatureManager(pPVar3->context_);
    if (local_b8 != (Instruction *)0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar5 = *(uint32_t *)args_3;
  }
  return uVar5;
}

Assistant:

uint32_t GraphicsRobustAccessPass::GetGlslInsts() {
  if (module_status_.glsl_insts_id == 0) {
    // This string serves double-duty as raw data for a string and for a vector
    // of 32-bit words
    const char glsl[] = "GLSL.std.450";
    // Use an existing import if we can.
    for (auto& inst : context()->module()->ext_inst_imports()) {
      if (inst.GetInOperand(0).AsString() == glsl) {
        module_status_.glsl_insts_id = inst.result_id();
      }
    }
    if (module_status_.glsl_insts_id == 0) {
      // Make a new import instruction.
      module_status_.glsl_insts_id = TakeNextId();
      std::vector<uint32_t> words = spvtools::utils::MakeVector(glsl);
      auto import_inst = MakeUnique<Instruction>(
          context(), spv::Op::OpExtInstImport, 0, module_status_.glsl_insts_id,
          std::initializer_list<Operand>{
              Operand{SPV_OPERAND_TYPE_LITERAL_STRING, std::move(words)}});
      Instruction* inst = import_inst.get();
      context()->module()->AddExtInstImport(std::move(import_inst));
      module_status_.modified = true;
      context()->AnalyzeDefUse(inst);
      // Invalidates the feature manager, since we added an extended instruction
      // set import.
      context()->ResetFeatureManager();
    }
  }
  return module_status_.glsl_insts_id;
}